

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O0

void __thiscall SAT::saveCurrentPolarities(SAT *this)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool *pbVar5;
  long in_RDI;
  uint i;
  uint local_c;
  
  for (local_c = 0; uVar2 = vec<signed_char>::size((vec<signed_char> *)(in_RDI + 0x50)),
      local_c < uVar2; local_c = local_c + 1) {
    pcVar4 = vec<signed_char>::operator[]((vec<signed_char> *)(in_RDI + 0x50),local_c);
    cVar1 = *pcVar4;
    iVar3 = toInt((lbool)0x0);
    if (cVar1 == iVar3) {
      pbVar5 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1e0),local_c);
      *pbVar5 = false;
    }
    else {
      pcVar4 = vec<signed_char>::operator[]((vec<signed_char> *)(in_RDI + 0x50),local_c);
      cVar1 = *pcVar4;
      iVar3 = toInt((lbool)0x0);
      if (cVar1 == iVar3) {
        pbVar5 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1e0),local_c);
        *pbVar5 = true;
      }
    }
  }
  return;
}

Assistant:

void saveCurrentPolarities() {
		for (unsigned int i = 0; i < assigns.size(); i++) {
			if (assigns[i] == toInt(l_True)) {
				polarity[i] = false;  // False means to branch 'true' on this SAT variable
			} else if (assigns[i] == toInt(l_False)) {
				polarity[i] = true;  // True means to branch 'false' on this SAT variable
			}
		}
	}